

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,FunctionCallStmt *stmt)

{
  element_type *peVar1;
  _Base_ptr p_Var2;
  uint64_t uVar3;
  ulong local_80 [4];
  undefined1 local_60 [8];
  shared_ptr<kratos::FunctionStmtBlock> func;
  string str;
  
  std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)local_60,
             &(stmt->func_).
              super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string
            ((string *)
             &func.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(string *)((long)local_60 + 0xe8));
  peVar1 = (stmt->var_).super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  for (p_Var2 = *(_Base_ptr *)
                 ((long)&(peVar1->args_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var2 != &(peVar1->args_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    (**(code **)(**(long **)(p_Var2 + 2) + 0xf8))((string *)local_80);
    std::__cxx11::string::append
              ((string *)
               &func.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)local_80);
  }
  uVar3 = hash_64_fnv1a(func.
                        super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,(uint64_t)str._M_dataplus._M_p);
  local_80[0] = uVar3 << ((byte)(this->super_IRVisitor).level & 0x3f) ^ 0xe3779b97f4a7c169;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->stmt_hashes_,local_80);
  std::__cxx11::string::~string
            ((string *)
             &func.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func);
  return;
}

Assistant:

void visit(FunctionCallStmt* stmt) override {
        // this is to hash the call args and func_def
        auto func = stmt->func();
        auto str = func->function_name();
        auto const& var = stmt->var();
        auto const& var_args = var->args();
        // this is ordered map
        for (auto const& iter : var_args) {
            str.append(iter.second->to_string());
        }
        uint64_t hash = hash_64_fnv1a(str.c_str(), str.size()) << level;
        constexpr uint64_t call_signature = shift_const(0x9e3779b97f4a7c16, 4);
        stmt_hashes_.emplace_back(hash ^ call_signature);
    }